

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

unsigned_long CRC32Value(int i)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = (ulong)i;
  for (iVar3 = -8; iVar3 != 0; iVar3 = iVar3 + 1) {
    uVar4 = uVar2 >> 1;
    uVar1 = uVar2 & 1;
    uVar2 = uVar4 ^ 0xedb88320;
    if (uVar1 == 0) {
      uVar2 = uVar4;
    }
  }
  return uVar2;
}

Assistant:

unsigned long CRC32Value(int i)
{
    int j;
    unsigned long ulCRC;
    ulCRC = i;
    for ( j = 8 ; j > 0; j-- )
    {
        if ( ulCRC & 1 )
            ulCRC = ( ulCRC >> 1 ) ^ CRC32_POLYNOMIAL;
        else
            ulCRC >>= 1;
    }
    return ulCRC;
}